

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O2

int ImfHeaderV3fAttribute(ImfHeader *hdr,char *name,float *x,float *y,float *z)

{
  TypedAttribute<Imath_3_2::Vec3<float>_> *pTVar1;
  
  pTVar1 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Vec3<float>>>
                     ((Header *)hdr,name);
  *x = (pTVar1->_value).x;
  *y = (pTVar1->_value).y;
  *z = (pTVar1->_value).z;
  return 1;
}

Assistant:

int
ImfHeaderV3fAttribute (
    const ImfHeader* hdr, const char name[], float* x, float* y, float* z)
{
    try
    {
        const V3f& v =
            header (hdr)
                ->typedAttribute<OPENEXR_IMF_INTERNAL_NAMESPACE::V3fAttribute> (
                    name)
                .value ();

        *x = v.x;
        *y = v.y;
        *z = v.z;

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}